

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O3

bool S_ChangeMusic(char *musicname,int order,bool looping,bool force)

{
  Node *pNVar1;
  Node *pNVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  FString *this;
  long lVar9;
  FWadLump *this_00;
  ulong uVar10;
  ulong uVar11;
  MusInfo *pMVar12;
  undefined7 in_register_00000009;
  Node *pNVar13;
  Node *pNVar14;
  MidiDeviceSetting *device;
  float rel_vol;
  FString DEH_Music;
  FString local_38;
  
  if (((int)CONCAT71(in_register_00000009,force) == 0) && (PlayList != (FPlayList *)0x0)) {
    return false;
  }
  if (musicname == (char *)0x0) goto LAB_002fcb84;
  cVar3 = *musicname;
  if (cVar3 == '*') {
    if (musicname[1] == '\0') {
      if (((gamestate != GS_TITLELEVEL) && (gamestate != GS_LEVEL)) ||
         (level.Music.Chars == (char *)0x0)) goto LAB_002fcb84;
      cVar3 = *level.Music.Chars;
      musicname = level.Music.Chars;
      order = level.musicorder;
      goto LAB_002fca69;
    }
  }
  else {
LAB_002fca69:
    if (cVar3 == '\0') {
LAB_002fcb84:
      S_StopMusic(true);
      FString::operator=(&mus_playing.name,(char *)"");
      FString::operator=(&LastSong,(char *)"");
      return true;
    }
  }
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_38.Chars = FString::NullString.Nothing;
  if ((*musicname == '$') &&
     (pcVar8 = FStringTable::operator[](&GStrings,musicname + 1), pcVar8 != (char *)0x0)) {
    this = FString::operator+=(&local_38,"D_");
    FString::operator+=(this,pcVar8);
    musicname = local_38.Chars;
  }
  uVar5 = FName::NameManager::FindName(&FName::NameData,musicname,false);
  pMVar12 = mus_playing.handle;
  pNVar2 = MusicAliases.Nodes + (MusicAliases.Size - 1 & uVar5);
  do {
    pNVar13 = pNVar2;
    if ((pNVar13 == (Node *)0x0) || (pNVar13->Next == (Node *)0x1)) goto LAB_002fcb17;
    pNVar2 = pNVar13->Next;
  } while ((pNVar13->Pair).Key.Index != uVar5);
  lVar9 = (long)(pNVar13->Pair).Value.Index;
  if (lVar9 == 0) {
LAB_002fcd5e:
    pMVar12 = (MusInfo *)0x1;
  }
  else {
    musicname = FName::NameData.NameArray[lVar9].Text;
LAB_002fcb17:
    if (((mus_playing.handle != (MusInfo *)0x0 && *(int *)(mus_playing.name.Chars + -0xc) != 0) &&
        (iVar6 = strcasecmp(mus_playing.name.Chars,musicname), iVar6 == 0)) &&
       (pMVar12->m_Looping == looping)) {
      if (order == mus_playing.baseorder) {
        iVar6 = (*pMVar12->_vptr_MusInfo[8])(pMVar12);
        pMVar12 = (MusInfo *)0x1;
        if ((char)iVar6 == '\0') {
          (*(mus_playing.handle)->_vptr_MusInfo[4])(mus_playing.handle,looping,(ulong)(uint)order);
        }
      }
      else {
        iVar6 = (*pMVar12->_vptr_MusInfo[0xc])(pMVar12,(ulong)(uint)order);
        pMVar12 = (MusInfo *)0x1;
        if ((char)iVar6 != '\0') {
          mus_playing.baseorder = order;
        }
      }
      goto LAB_002fce74;
    }
    iVar6 = strncasecmp(musicname,",CD,",4);
    if (iVar6 == 0) {
      iVar6 = 0;
      uVar10 = strtoul(musicname + 4,(char **)0x0,0);
      pcVar8 = strchr(musicname + 4,0x2c);
      if (pcVar8 != (char *)0x0) {
        uVar11 = strtoul(pcVar8 + 1,(char **)0x0,0x10);
        iVar6 = (int)uVar11;
      }
      S_StopMusic(true);
      mus_playing.handle = I_RegisterCDSong((int)uVar10,iVar6);
LAB_002fcd03:
      mus_playing.loop = looping;
      FString::operator=(&mus_playing.name,musicname);
      mus_playing.baseorder = 0;
      FString::operator=(&LastSong,(char *)"");
      pMVar12 = mus_playing.handle;
      if (mus_playing.handle != (MusInfo *)0x0) {
        rel_vol = S_GetMusicVolume(musicname);
        MusInfo::Start(pMVar12,looping,rel_vol,order);
        mus_playing.baseorder = order;
        goto LAB_002fcd5e;
      }
    }
    else {
      uVar5 = FName::NameManager::FindName(&FName::NameData,musicname,false);
      pNVar1 = MidiDevices.Nodes + (MidiDevices.Size - 1 & uVar5);
      do {
        pNVar14 = pNVar1;
        if ((pNVar14 == (Node *)0x0) || (pNVar14->Next == (Node *)0x1)) {
          pNVar14 = (Node *)0x0;
          break;
        }
        pNVar1 = pNVar14->Next;
      } while ((pNVar14->Pair).Key.Index != uVar5);
      device = &(pNVar14->Pair).Value;
      if (pNVar14 == (Node *)0x0) {
        device = (MidiDeviceSetting *)0x0;
      }
      iVar6 = strncmp(musicname,"file://",7);
      if (iVar6 == 0) {
        musicname = musicname + 7;
      }
      bVar4 = FileExists(musicname);
      if (bVar4) {
        this_00 = (FWadLump *)operator_new(0x30);
        FileReader::FileReader((FileReader *)this_00,musicname);
        pMVar12 = (MusInfo *)0x0;
LAB_002fcc6b:
        S_StopMusic(true);
        if (snd_musicvolume.Value <= 0.0) {
          mus_playing.loop = looping;
          FString::operator=(&mus_playing.name,musicname);
          mus_playing.baseorder = order;
          FString::operator=(&LastSong,musicname);
          pMVar12 = (MusInfo *)0x1;
          if (this_00 != (FWadLump *)0x0) {
            (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
          }
          goto LAB_002fce74;
        }
        if (pMVar12 == (MusInfo *)0x0) {
          mus_playing.handle = I_RegisterSong(&this_00->super_FileReader,device);
        }
        else {
          mus_playing.handle = pMVar12;
          if (this_00 != (FWadLump *)0x0) {
            (*(this_00->super_FileReader).super_FileReaderBase._vptr_FileReaderBase[1])(this_00);
          }
        }
        goto LAB_002fcd03;
      }
      iVar6 = FWadCollection::CheckNumForFullName(&Wads,musicname,true,0x10);
      if (iVar6 == -1) {
        pcVar8 = strstr(musicname,"://");
        if (musicname < pcVar8) {
          pMVar12 = I_RegisterURLSong(musicname);
          if (pMVar12 != (MusInfo *)0x0) {
            this_00 = (FWadLump *)0x0;
            goto LAB_002fcc6b;
          }
          pcVar8 = "Could not open \"%s\"\n";
        }
        else {
          pcVar8 = "Music \"%s\" not found\n";
        }
        pMVar12 = (MusInfo *)0x0;
        Printf(pcVar8,musicname);
        goto LAB_002fce74;
      }
      iVar7 = FWadCollection::LumpLength(&Wads,iVar6);
      if (iVar7 != 0) {
        this_00 = FWadCollection::ReopenLumpNumNewFile(&Wads,iVar6);
        pMVar12 = (MusInfo *)0x0;
        if (this_00 == (FWadLump *)0x0) goto LAB_002fce74;
        goto LAB_002fcc6b;
      }
    }
    pMVar12 = (MusInfo *)0x0;
  }
LAB_002fce74:
  FString::~FString(&local_38);
  return SUB81(pMVar12,0);
}

Assistant:

bool S_ChangeMusic (const char *musicname, int order, bool looping, bool force)
{
	if (!force && PlayList)
	{ // Don't change if a playlist is active
		return false;
	}

	// allow specifying "*" as a placeholder to play the level's default music.
	if (musicname != NULL && !strcmp(musicname, "*"))
	{
		if (gamestate == GS_LEVEL || gamestate == GS_TITLELEVEL)
		{
			musicname = level.Music;
			order = level.musicorder;
		}
		else
		{
			musicname = NULL;
		}
	}

	if (musicname == NULL || musicname[0] == 0)
	{
		// Don't choke if the map doesn't have a song attached
		S_StopMusic (true);
		mus_playing.name = "";
		LastSong = "";
		return true;
	}

	FString DEH_Music;
	if (musicname[0] == '$')
	{
		// handle dehacked replacement.
		// Any music name defined this way needs to be prefixed with 'D_' because
		// Doom.exe does not contain the prefix so these strings don't either.
		const char * mus_string = GStrings[musicname+1];
		if (mus_string != NULL)
		{
			DEH_Music << "D_" << mus_string;
			musicname = DEH_Music;
		}
	}

	FName *aliasp = MusicAliases.CheckKey(musicname);
	if (aliasp != NULL) 
	{
		if (*aliasp == NAME_None)
		{
			return true;	// flagged to be ignored
		}
		musicname = aliasp->GetChars();
	}

	if (!mus_playing.name.IsEmpty() &&
		mus_playing.handle != NULL &&
		stricmp (mus_playing.name, musicname) == 0 &&
		mus_playing.handle->m_Looping == looping)
	{
		if (order != mus_playing.baseorder)
		{
			if (mus_playing.handle->SetSubsong(order))
			{
				mus_playing.baseorder = order;
			}
		}
		else if (!mus_playing.handle->IsPlaying())
		{
			mus_playing.handle->Play(looping, order);
		}
		return true;
	}

	if (strnicmp (musicname, ",CD,", 4) == 0)
	{
		int track = strtoul (musicname+4, NULL, 0);
		const char *more = strchr (musicname+4, ',');
		unsigned int id = 0;

		if (more != NULL)
		{
			id = strtoul (more+1, NULL, 16);
		}
		S_StopMusic (true);
		mus_playing.handle = I_RegisterCDSong (track, id);
	}
	else
	{
		int lumpnum = -1;
		int length = 0;
		MusInfo *handle = NULL;
		MidiDeviceSetting *devp = MidiDevices.CheckKey(musicname);

		// Strip off any leading file:// component.
		if (strncmp(musicname, "file://", 7) == 0)
		{
			musicname += 7;
		}

		FileReader *reader = NULL;
		if (!FileExists (musicname))
		{
			if ((lumpnum = Wads.CheckNumForFullName (musicname, true, ns_music)) == -1)
			{
				if (strstr(musicname, "://") > musicname)
				{
					// Looks like a URL; try it as such.
					handle = I_RegisterURLSong(musicname);
					if (handle == NULL)
					{
						Printf ("Could not open \"%s\"\n", musicname);
						return false;
					}
				}
				else
				{
					Printf ("Music \"%s\" not found\n", musicname);
					return false;
				}
			}
			if (handle == NULL)
			{
				if (Wads.LumpLength (lumpnum) == 0)
				{
					return false;
				}
				reader = Wads.ReopenLumpNumNewFile(lumpnum);
				if (reader == NULL)
				{
					return false;
				}
			}
		}
		else
		{
			// Load an external file.
			reader = new FileReader(musicname);
		}

		// shutdown old music
		S_StopMusic (true);

		// Just record it if volume is 0
		if (snd_musicvolume <= 0)
		{
			mus_playing.loop = looping;
			mus_playing.name = musicname;
			mus_playing.baseorder = order;
			LastSong = musicname;
			delete reader;
			return true;
		}

		// load & register it
		if (handle != NULL)
		{
			mus_playing.handle = handle;
			delete reader;
		}
		else
		{
			mus_playing.handle = I_RegisterSong (reader, devp);
		}
	}

	mus_playing.loop = looping;
	mus_playing.name = musicname;
	mus_playing.baseorder = 0;
	LastSong = "";

	if (mus_playing.handle != 0)
	{ // play it
		mus_playing.handle->Start(looping, S_GetMusicVolume (musicname), order);
		mus_playing.baseorder = order;
		return true;
	}
	return false;
}